

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeGetNumJTSetupEvals(void *arkode_mem,long *njtsetups)

{
  int iVar1;
  ARKLsMem in_RAX;
  ARKLsMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x5ae,"ARKodeGetNumJTSetupEvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    if (*(int *)((long)arkode_mem + 0x128) == 0) {
      *njtsetups = 0;
    }
    else {
      arkls_mem = in_RAX;
      iVar1 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeGetNumJTSetupEvals",&arkls_mem);
      if (iVar1 != 0) {
        return iVar1;
      }
      *njtsetups = arkls_mem->njtsetup;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeGetNumJTSetupEvals(void* arkode_mem, long int* njtsetups)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_implicit)
  {
    *njtsetups = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *njtsetups = arkls_mem->njtsetup;
  return (ARKLS_SUCCESS);
}